

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

bool __thiscall GGWave::decode(GGWave *this,void *data,uint32_t nBytes)

{
  float fVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  uchar uVar5;
  ushort uVar6;
  short sVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  uchar *puVar11;
  float *pfVar12;
  uint in_EDX;
  void *in_RSI;
  float *in_RDI;
  int i_5;
  int nExtraSamples;
  int i_4;
  int nSamplesResampled;
  uint32_t offset;
  int i_3;
  int16_t *p_3;
  float scale_3;
  int i_2;
  uint16_t *p_2;
  float scale_2;
  int i_1;
  int8_t *p_1;
  float scale_1;
  int i;
  uint8_t *p;
  float scale;
  int nSamplesRecorded;
  uint32_t nBytesRecorded;
  uint32_t nBytesNeeded;
  float factor;
  uint8_t *dataBuffer;
  GGWave *in_stack_00000280;
  GGWave *in_stack_00000440;
  float in_stack_ffffffffffffff20;
  uint in_stack_ffffffffffffff24;
  uint local_ac;
  int local_90;
  int local_88;
  int local_7c;
  float *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  uchar *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  int local_4c;
  uint local_38;
  uint local_30;
  void *local_28;
  uint local_1c;
  bool local_1;
  
  if (((uint)in_RDI[0x13] & 1) == 0) {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,
              "Rx is disabled - cannot receive data with this GGWave instance\n");
    }
    local_1 = false;
  }
  else if (((uint)in_RDI[0xca] & 1) == 0) {
    fVar1 = *in_RDI;
    fVar2 = in_RDI[2];
    local_28 = in_RSI;
    local_1c = in_EDX;
    while( true ) {
      local_30 = (int)in_RDI[0x2b] * (int)in_RDI[5];
      if ((*(byte *)((long)in_RDI + 0x4e) & 1) != 0) {
        ggvector<float>::data((ggvector<float> *)(in_RDI + 0x42));
        iVar10 = Resampler::resample((Resampler *)
                                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                     (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                     (int)in_stack_ffffffffffffff98,
                                     (float *)CONCAT44(in_stack_ffffffffffffff94,
                                                       in_stack_ffffffffffffff90),
                                     in_stack_ffffffffffffff88);
        local_30 = (iVar10 + 4) * (int)in_RDI[5];
      }
      if (local_1c < local_30) {
        local_ac = local_1c;
      }
      else {
        local_ac = local_30;
      }
      if (local_ac == 0) goto LAB_0010cba5;
      fVar8 = in_RDI[7];
      if (fVar8 != 0.0) {
        if ((int)fVar8 - 1U < 4) {
          puVar11 = ggvector<unsigned_char>::data((ggvector<unsigned_char> *)(in_RDI + 0x46));
          memcpy(puVar11,local_28,(ulong)local_ac);
        }
        else if (fVar8 == 7.00649e-45) {
          pfVar12 = ggvector<float>::data((ggvector<float> *)(in_RDI + 0x42));
          memcpy(pfVar12,local_28,(ulong)local_ac);
        }
      }
      local_28 = (void *)((long)local_28 + (ulong)local_ac);
      local_1c = local_1c - local_ac;
      if (local_ac % (uint)in_RDI[5] != 0) {
        if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
          fprintf((anonymous_namespace)::g_fptr,
                  "Failure during capture - provided bytes (%d) are not multiple of sample size (%d)\n"
                  ,(ulong)local_ac,(ulong)(uint)in_RDI[5]);
        }
        in_RDI[0x2b] = in_RDI[3];
        goto LAB_0010cba5;
      }
      local_38 = local_ac / (uint)in_RDI[5];
      switch(in_RDI[7]) {
      case 0.0:
        break;
      case 1.4013e-45:
        puVar11 = ggvector<unsigned_char>::data((ggvector<unsigned_char> *)(in_RDI + 0x46));
        for (local_4c = 0; local_4c < (int)local_38; local_4c = local_4c + 1) {
          bVar4 = puVar11[local_4c];
          pfVar12 = ggvector<float>::operator[]((ggvector<float> *)(in_RDI + 0x42),local_4c);
          *pfVar12 = (float)((short)(ushort)bVar4 + -0x80) * 0.0078125;
        }
        break;
      case 2.8026e-45:
        puVar11 = ggvector<unsigned_char>::data((ggvector<unsigned_char> *)(in_RDI + 0x46));
        for (in_stack_ffffffffffffffa4 = 0; in_stack_ffffffffffffffa4 < (int)local_38;
            in_stack_ffffffffffffffa4 = in_stack_ffffffffffffffa4 + 1) {
          uVar5 = puVar11[in_stack_ffffffffffffffa4];
          pfVar12 = ggvector<float>::operator[]
                              ((ggvector<float> *)(in_RDI + 0x42),in_stack_ffffffffffffffa4);
          *pfVar12 = (float)(int)(char)uVar5 * 0.0078125;
        }
        break;
      case 4.2039e-45:
        in_stack_ffffffffffffffa0 = 0x38000000;
        in_stack_ffffffffffffff98 =
             ggvector<unsigned_char>::data((ggvector<unsigned_char> *)(in_RDI + 0x46));
        for (in_stack_ffffffffffffff94 = 0; in_stack_ffffffffffffff94 < (int)local_38;
            in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1) {
          uVar6 = *(ushort *)(in_stack_ffffffffffffff98 + (long)in_stack_ffffffffffffff94 * 2);
          pfVar12 = ggvector<float>::operator[]
                              ((ggvector<float> *)(in_RDI + 0x42),in_stack_ffffffffffffff94);
          *pfVar12 = (float)(int)(uVar6 - 0x8000) * 3.0517578e-05;
        }
        break;
      case 5.60519e-45:
        in_stack_ffffffffffffff90 = 0x38000000;
        in_stack_ffffffffffffff88 =
             (float *)ggvector<unsigned_char>::data((ggvector<unsigned_char> *)(in_RDI + 0x46));
        for (local_7c = 0; local_7c < (int)local_38; local_7c = local_7c + 1) {
          sVar7 = *(short *)((long)in_stack_ffffffffffffff88 + (long)local_7c * 2);
          pfVar12 = ggvector<float>::operator[]((ggvector<float> *)(in_RDI + 0x42),local_7c);
          *pfVar12 = (float)(int)sVar7 * 3.0517578e-05;
        }
        break;
      case 7.00649e-45:
      }
      fVar8 = in_RDI[3];
      fVar9 = in_RDI[0x2b];
      if ((*(byte *)((long)in_RDI + 0x4e) & 1) == 0) {
        for (local_88 = 0; local_88 < (int)local_38; local_88 = local_88 + 1) {
          pfVar12 = ggvector<float>::operator[]((ggvector<float> *)(in_RDI + 0x42),local_88);
          fVar3 = *pfVar12;
          pfVar12 = ggvector<float>::operator[]
                              ((ggvector<float> *)(in_RDI + 0x3e),
                               ((int)fVar8 - (int)fVar9) + local_88);
          *pfVar12 = fVar3;
        }
      }
      else {
        if ((int)local_38 < 0x81) {
          in_RDI[0x2b] = in_RDI[3];
          goto LAB_0010cba5;
        }
        if ((((uint)in_RDI[0x22] & 1) == 0) &&
           (iVar10 = Resampler::nSamplesTotal((Resampler *)(in_RDI + 0x154)),
           (fVar1 / fVar2) * 60.0 * in_RDI[2] < (float)iVar10)) {
          Resampler::reset((Resampler *)
                           CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20));
        }
        in_stack_ffffffffffffff20 = fVar1 / fVar2;
        ggvector<float>::data((ggvector<float> *)(in_RDI + 0x42));
        ggvector<float>::data((ggvector<float> *)(in_RDI + 0x3e));
        iVar10 = Resampler::resample((Resampler *)
                                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                     (float)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                                     (int)in_stack_ffffffffffffff98,
                                     (float *)CONCAT44(in_stack_ffffffffffffff94,
                                                       in_stack_ffffffffffffff90),
                                     in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff24 = local_38;
        local_38 = ((int)fVar8 - (int)fVar9) + iVar10;
      }
      if ((int)local_38 < (int)in_RDI[3]) break;
      *(undefined1 *)((long)in_RDI + 0xe2) = 1;
      if (((uint)in_RDI[0x11] & 1) == 0) {
        decode_variable(in_stack_00000440);
      }
      else {
        decode_fixed(in_stack_00000280);
      }
      fVar8 = in_RDI[3];
      for (local_90 = 0; local_90 < (int)(local_38 - (int)fVar8); local_90 = local_90 + 1) {
        pfVar12 = ggvector<float>::operator[]
                            ((ggvector<float> *)(in_RDI + 0x3e),(int)in_RDI[3] + local_90);
        fVar9 = *pfVar12;
        pfVar12 = ggvector<float>::operator[]((ggvector<float> *)(in_RDI + 0x3e),local_90);
        *pfVar12 = fVar9;
      }
      in_RDI[0x2b] = (float)((int)in_RDI[3] - (local_38 - (int)fVar8));
    }
    in_RDI[0x2b] = (float)((int)in_RDI[3] - local_38);
LAB_0010cba5:
    local_1 = true;
  }
  else {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Cannot decode while transmitting\n");
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GGWave::decode(const void * data, uint32_t nBytes) {
    if (m_isRxEnabled == false) {
        ggprintf("Rx is disabled - cannot receive data with this GGWave instance\n");
        return false;
    }

    if (m_tx.hasData) {
        ggprintf("Cannot decode while transmitting\n");
        return false;
    }

    auto dataBuffer = (uint8_t *) data;
    const float factor = m_sampleRateInp/m_sampleRate;

    while (true) {
        // read capture data
        uint32_t nBytesNeeded = m_rx.samplesNeeded*m_sampleSizeInp;

        if (m_needResampling) {
            // note : predict 4 extra samples just to make sure we have enough data
            nBytesNeeded = (m_resampler.resample(1.0f/factor, m_rx.samplesNeeded, m_rx.amplitudeResampled.data(), nullptr) + 4)*m_sampleSizeInp;
        }

        const uint32_t nBytesRecorded = GG_MIN(nBytes, nBytesNeeded);

        if (nBytesRecorded == 0) {
            break;
        }

        switch (m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: break;
            case GGWAVE_SAMPLE_FORMAT_U8:
            case GGWAVE_SAMPLE_FORMAT_I8:
            case GGWAVE_SAMPLE_FORMAT_U16:
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    memcpy(m_rx.amplitudeTmp.data(), dataBuffer, nBytesRecorded);
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32:
                {
                    memcpy(m_rx.amplitudeResampled.data(), dataBuffer, nBytesRecorded);
                } break;
        }

        dataBuffer += nBytesRecorded;
        nBytes -= nBytesRecorded;

        if (nBytesRecorded % m_sampleSizeInp != 0) {
            ggprintf("Failure during capture - provided bytes (%d) are not multiple of sample size (%d)\n",
                    nBytesRecorded, m_sampleSizeInp);
            m_rx.samplesNeeded = m_samplesPerFrame;
            break;
        }

        // convert to 32-bit float
        int nSamplesRecorded = nBytesRecorded/m_sampleSizeInp;
        switch (m_sampleFormatInp) {
            case GGWAVE_SAMPLE_FORMAT_UNDEFINED: break;
            case GGWAVE_SAMPLE_FORMAT_U8:
                {
                    constexpr float scale = 1.0f/128;
                    auto p = reinterpret_cast<uint8_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(int16_t(*(p + i)) - 128)*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I8:
                {
                    constexpr float scale = 1.0f/128;
                    auto p = reinterpret_cast<int8_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(*(p + i))*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_U16:
                {
                    constexpr float scale = 1.0f/32768;
                    auto p = reinterpret_cast<uint16_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(int32_t(*(p + i)) - 32768)*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_I16:
                {
                    constexpr float scale = 1.0f/32768;
                    auto p = reinterpret_cast<int16_t *>(m_rx.amplitudeTmp.data());
                    for (int i = 0; i < nSamplesRecorded; ++i) {
                        m_rx.amplitudeResampled[i] = float(*(p + i))*scale;
                    }
                } break;
            case GGWAVE_SAMPLE_FORMAT_F32: break;
        }

        uint32_t offset = m_samplesPerFrame - m_rx.samplesNeeded;

        if (m_needResampling) {
            if (nSamplesRecorded <= 2*Resampler::kWidth) {
                m_rx.samplesNeeded = m_samplesPerFrame;
                break;
            }

            // reset resampler state every minute
            if (!m_rx.receiving && m_resampler.nSamplesTotal() > 60.0f*factor*m_sampleRate) {
                m_resampler.reset();
            }

            int nSamplesResampled = offset + m_resampler.resample(factor, nSamplesRecorded, m_rx.amplitudeResampled.data(), m_rx.amplitude.data() + offset);
            nSamplesRecorded = nSamplesResampled;
        } else {
            for (int i = 0; i < nSamplesRecorded; ++i) {
                m_rx.amplitude[offset + i] = m_rx.amplitudeResampled[i];
            }
        }

        // we have enough bytes to do analysis
        if (nSamplesRecorded >= m_samplesPerFrame) {
            m_rx.hasNewAmplitude = true;

            if (m_isFixedPayloadLength) {
                decode_fixed();
            } else {
                decode_variable();
            }

            int nExtraSamples = nSamplesRecorded - m_samplesPerFrame;
            for (int i = 0; i < nExtraSamples; ++i) {
                m_rx.amplitude[i] = m_rx.amplitude[m_samplesPerFrame + i];
            }

            m_rx.samplesNeeded = m_samplesPerFrame - nExtraSamples;
        } else {
            m_rx.samplesNeeded = m_samplesPerFrame - nSamplesRecorded;
            break;
        }
    }

    return true;
}